

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> *
FromBytes(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
         span<const_std::byte,_18446744073709551615UL> source)

{
  byte bVar1;
  ulong *puVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int bit_i;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  reference rVar10;
  allocator_type local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (int)source._M_extent._M_extent_value << 3;
  std::vector<bool,_std::allocator<bool>_>::vector(__return_storage_ptr__,(long)iVar3,&local_39);
  uVar8 = iVar3 >> 3;
  uVar5 = 0;
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = uVar5;
  }
  for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
    bVar1 = source._M_ptr[uVar6];
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (__return_storage_ptr__,uVar5 + lVar7);
      puVar2 = rVar10._M_p;
      if ((bVar1 >> ((uint)lVar7 & 0x1f) & 1) == 0) {
        uVar4 = ~rVar10._M_mask & *puVar2;
      }
      else {
        uVar4 = rVar10._M_mask | *puVar2;
      }
      *puVar2 = uVar4;
    }
    uVar5 = uVar5 + 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<bool> FromBytes(std::span<const std::byte> source)
{
    int vector_size(source.size() * 8);
    std::vector<bool> result(vector_size);
    for (int byte_i = 0; byte_i < vector_size / 8; ++byte_i) {
        uint8_t cur_byte{std::to_integer<uint8_t>(source[byte_i])};
        for (int bit_i = 0; bit_i < 8; ++bit_i) {
            result[byte_i * 8 + bit_i] = (cur_byte >> bit_i) & 1;
        }
    }
    return result;
}